

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_doc_update(fdb_doc **doc,void *meta,size_t metalen,void *body,size_t bodylen)

{
  void *pvVar1;
  void *in_RCX;
  ulong in_RDX;
  void *in_RSI;
  long *in_RDI;
  ulong in_R8;
  fdb_status local_4;
  
  if (((in_RDI == (long *)0x0) || (0xffff < in_RDX)) || (0xffffffff < in_R8)) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else if (*in_RDI == 0) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    if ((in_RSI != (void *)0x0) && (in_RDX != 0)) {
      free(*(void **)(*in_RDI + 0x38));
      pvVar1 = malloc(in_RDX);
      *(void **)(*in_RDI + 0x38) = pvVar1;
      if (*(long *)(*in_RDI + 0x38) == 0) {
        return FDB_RESULT_ALLOC_FAIL;
      }
      memcpy(*(void **)(*in_RDI + 0x38),in_RSI,in_RDX);
      *(ulong *)(*in_RDI + 8) = in_RDX;
    }
    if ((in_RCX != (void *)0x0) && (in_R8 != 0)) {
      free(*(void **)(*in_RDI + 0x40));
      pvVar1 = malloc(in_R8);
      *(void **)(*in_RDI + 0x40) = pvVar1;
      if (*(long *)(*in_RDI + 0x40) == 0) {
        return FDB_RESULT_ALLOC_FAIL;
      }
      memcpy(*(void **)(*in_RDI + 0x40),in_RCX,in_R8);
      *(ulong *)(*in_RDI + 0x10) = in_R8;
    }
    *(undefined8 *)(*in_RDI + 0x28) = 0xffffffffffffffff;
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_doc_update(fdb_doc **doc,
                          const void *meta, size_t metalen,
                          const void *body, size_t bodylen)
{
    if (doc == NULL ||
        metalen > FDB_MAX_METALEN || bodylen > FDB_MAX_BODYLEN) {
        return FDB_RESULT_INVALID_ARGS;
    }
    if (*doc == NULL) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (meta && metalen > 0) {
        // free previous metadata
        free((*doc)->meta);
        // allocate new metadata
        (*doc)->meta = (void *)malloc(metalen);
        if ((*doc)->meta == NULL) { // LCOV_EXCL_START
            return FDB_RESULT_ALLOC_FAIL;
        } // LCOV_EXCL_STOP
        memcpy((*doc)->meta, meta, metalen);
        (*doc)->metalen = metalen;
    }

    if (body && bodylen > 0) {
        // free previous body
        free((*doc)->body);
        // allocate new body
        (*doc)->body = (void *)malloc(bodylen);
        if ((*doc)->body == NULL) { // LCOV_EXCL_START
            return FDB_RESULT_ALLOC_FAIL;
        } // LCOV_EXCL_STOP
        memcpy((*doc)->body, body, bodylen);
        (*doc)->bodylen = bodylen;
    }

    (*doc)->seqnum = SEQNUM_NOT_USED;
    return FDB_RESULT_SUCCESS;
}